

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

bool CLOptionsHelper::file_exists(string *name,bool hard_check)

{
  char cVar1;
  undefined1 uVar2;
  char *pcVar3;
  ostream *poVar4;
  ifstream f;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&f,pcVar3,_S_in);
  cVar1 = std::ios::good();
  if (cVar1 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"[ERROR] File does not exist:\n   \"");
    poVar4 = std::operator<<(poVar4,(string *)name);
    poVar4 = std::operator<<(poVar4,"\"");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  uVar2 = std::ios::good();
  std::ifstream::~ifstream(&f);
  return (bool)uVar2;
}

Assistant:

static inline bool file_exists (const std::string& name, bool hard_check=true) {
        std::ifstream f( name.c_str() );
        if ( !f.good() && hard_check ) {
            // note that the name is put in quotes to show when
            // extra white space has been added
            std::cout << "[ERROR] File does not exist:\n   \"" << name << "\"" << std::endl;
        }
        return f.good();
    }